

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::TcParser::VerifyHasBitConsistency
               (MessageLite *msg,TcParseTableBase *table)

{
  bool bVar1;
  ushort uVar2;
  iterator pFVar3;
  FieldAux *pFVar4;
  void **ppvVar5;
  bool *pbVar6;
  bool *pbVar7;
  uint *puVar8;
  unsigned_long *puVar9;
  ArenaStringPtr *this;
  Cord *pCVar10;
  Cord *pCVar11;
  char *pcVar12;
  InlinedStringField *pIVar13;
  string *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  MessageLite **ppMVar15;
  LogMessage *pLVar16;
  string local_270;
  byte local_249;
  LogMessage local_248;
  Voidify local_231;
  string local_230;
  LogMessage local_210;
  Voidify local_1f9;
  Nullable<const_char_*> local_1f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_4;
  LogMessage local_1d0;
  Voidify local_1b9;
  Nullable<const_char_*> local_1b8;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  string local_1a8;
  byte local_181;
  LogMessage local_180;
  Voidify local_169;
  string local_168;
  LogMessage local_148;
  Voidify local_131;
  unsigned_long local_130;
  unsigned_long local_128;
  Nullable<const_char_*> local_120;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  LogMessage local_f8;
  Voidify local_e1;
  uint local_e0;
  uint local_dc;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_a0;
  Voidify local_89;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t offset;
  void *default_base;
  void *base;
  TcParseTableBase **ppTStack_60;
  bool has_bit;
  anon_class_24_3_63b2e8fc print_error;
  FieldEntry *entry;
  iterator __end2;
  iterator __begin2;
  Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry> *local_20;
  Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry> *__range2;
  TcParseTableBase *table_local;
  MessageLite *msg_local;
  
  if (table->has_bits_offset != 0) {
    __range2 = (Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry> *)table;
    table_local = (TcParseTableBase *)msg;
    ___begin2 = TcParseTableBase::field_entries(table);
    local_20 = (Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry> *)&__begin2;
    __end2 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry>::begin(local_20);
    pFVar3 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TcParseTableBase::FieldEntry>::end(local_20);
    for (; __end2 != pFVar3; __end2 = __end2 + 1) {
      print_error.entry = __end2;
      ppTStack_60 = &table_local;
      print_error.msg = (MessageLite **)&__range2;
      print_error.table = (TcParseTableBase **)__end2;
      if ((__end2->type_card & 0x30) != 0x10) {
        return;
      }
      base._7_1_ = anon_unknown_104::ReadHas(__end2,(MessageLite *)table_local);
      default_base = table_local;
      offset = (size_t)TcParseTableBase::default_instance((TcParseTableBase *)__range2);
      if (((print_error.entry)->type_card & 8) == 8) {
        pFVar4 = TcParseTableBase::field_aux((TcParseTableBase *)__range2,1);
        absl_log_internal_check_op_result = (Nullable<const_char_*>)(ulong)pFVar4->offset;
        ppvVar5 = RefAt<void_const*>(default_base,(size_t)absl_log_internal_check_op_result);
        default_base = *ppvVar5;
        ppvVar5 = RefAt<void_const*>((void *)offset,(size_t)absl_log_internal_check_op_result);
        offset = (size_t)*ppvVar5;
      }
      switch((print_error.entry)->type_card & 7) {
      case 1:
      case 3:
        if ((base._7_1_ & 1) != 0) {
          return;
        }
        uVar2 = (print_error.entry)->type_card & 0x1c0;
        if (((print_error.entry)->type_card & 0x1c0) == 0) {
          pbVar6 = RefAt<bool>(default_base,(ulong)(print_error.entry)->offset);
          pbVar6 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(pbVar6);
          pbVar7 = RefAt<bool>((void *)offset,(ulong)(print_error.entry)->offset);
          pbVar7 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(pbVar7);
          local_88 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                               (pbVar6,pbVar7,
                                "RefAt<bool>(base, entry.offset) == RefAt<bool>(default_base, entry.offset)"
                               );
          if (local_88 != (Nullable<const_char_*>)0x0) {
            pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x73,pcVar12);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_
                      ((string *)&absl_log_internal_check_op_result_1,&stack0xffffffffffffffa0);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                (pLVar16,(string *)&absl_log_internal_check_op_result_1);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar16);
            std::__cxx11::string::~string((string *)&absl_log_internal_check_op_result_1);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_a0);
          }
          local_88 = (Nullable<const_char_*>)0x0;
        }
        else if (uVar2 == 0x80) {
          puVar8 = RefAt<unsigned_int>(default_base,(ulong)(print_error.entry)->offset);
          local_dc = absl::lts_20250127::log_internal::GetReferenceableValue(*puVar8);
          puVar8 = RefAt<unsigned_int>((void *)offset,(ulong)(print_error.entry)->offset);
          local_e0 = absl::lts_20250127::log_internal::GetReferenceableValue(*puVar8);
          local_d8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                               (&local_dc,&local_e0,
                                "RefAt<uint32_t>(base, entry.offset) == RefAt<uint32_t>(default_base, entry.offset)"
                               );
          if (local_d8 != (Nullable<const_char_*>)0x0) {
            pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x78,pcVar12);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f8);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_
                      ((string *)&absl_log_internal_check_op_result_2,&stack0xffffffffffffffa0);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                (pLVar16,(string *)&absl_log_internal_check_op_result_2);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_e1,pLVar16);
            std::__cxx11::string::~string((string *)&absl_log_internal_check_op_result_2);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_f8);
          }
          local_d8 = (Nullable<const_char_*>)0x0;
        }
        else if (uVar2 == 0xc0) {
          puVar9 = RefAt<unsigned_long>(default_base,(ulong)(print_error.entry)->offset);
          local_128 = absl::lts_20250127::log_internal::GetReferenceableValue(*puVar9);
          puVar9 = RefAt<unsigned_long>((void *)offset,(ulong)(print_error.entry)->offset);
          local_130 = absl::lts_20250127::log_internal::GetReferenceableValue(*puVar9);
          local_120 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                                (&local_128,&local_130,
                                 "RefAt<uint64_t>(base, entry.offset) == RefAt<uint64_t>(default_base, entry.offset)"
                                );
          if (local_120 != (Nullable<const_char_*>)0x0) {
            pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_120);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x7d,pcVar12);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_168,&stack0xffffffffffffffa0);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,&local_168);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar16);
            std::__cxx11::string::~string((string *)&local_168);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_148);
          }
          local_120 = (Nullable<const_char_*>)0x0;
        }
        break;
      default:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb9);
      case 5:
        uVar2 = (print_error.entry)->type_card & 0x1c0;
        if (((print_error.entry)->type_card & 0x1c0) == 0) {
          if ((base._7_1_ & 1) != 0) {
            this = RefAt<google::protobuf::internal::ArenaStringPtr>
                             (default_base,(ulong)(print_error.entry)->offset);
            bVar1 = ArenaStringPtr::IsDefault(this);
            local_181 = 0;
            absl_log_internal_check_op_result_3._7_1_ = 0;
            if (bVar1) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_180,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x88,"!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault()");
              local_181 = 1;
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_180);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_1a8,&stack0xffffffffffffffa0);
              absl_log_internal_check_op_result_3._7_1_ = 1;
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,&local_1a8)
              ;
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_169,pLVar16);
            }
            if ((absl_log_internal_check_op_result_3._7_1_ & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1a8);
            }
            if ((local_181 & 1) != 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_180);
            }
          }
        }
        else if (uVar2 == 0x40) {
          if ((base._7_1_ & 1) == 0) {
            pIVar13 = RefAt<google::protobuf::internal::InlinedStringField>
                                (default_base,(ulong)(print_error.entry)->offset);
            psVar14 = InlinedStringField::Get_abi_cxx11_(pIVar13);
            v1 = absl::lts_20250127::log_internal::GetReferenceableValue<std::__cxx11::string>
                           (psVar14);
            pIVar13 = RefAt<google::protobuf::internal::InlinedStringField>
                                ((void *)offset,(ulong)(print_error.entry)->offset);
            psVar14 = InlinedStringField::Get_abi_cxx11_(pIVar13);
            v2 = absl::lts_20250127::log_internal::GetReferenceableValue<std::__cxx11::string>
                           (psVar14);
            local_1f8 = absl::lts_20250127::log_internal::
                        Check_EQImpl<std::__cxx11::string,std::__cxx11::string>
                                  (v1,v2,
                                   "RefAt<InlinedStringField>(base, entry.offset).Get() == RefAt<InlinedStringField>(default_base, entry.offset).Get()"
                                  );
            if (local_1f8 != (Nullable<const_char_*>)0x0) {
              pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_1f8);
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_210,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x9d,pcVar12);
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_210);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_230,&stack0xffffffffffffffa0);
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,&local_230)
              ;
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_1f9,pLVar16);
              std::__cxx11::string::~string((string *)&local_230);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_210);
            }
            local_1f8 = (Nullable<const_char_*>)0x0;
          }
        }
        else if (uVar2 == 0x80) {
          if ((base._7_1_ & 1) == 0) {
            pCVar10 = RefAt<absl::lts_20250127::Cord>
                                (default_base,(ulong)(print_error.entry)->offset);
            pCVar10 = absl::lts_20250127::log_internal::
                      GetReferenceableValue<absl::lts_20250127::Cord>(pCVar10);
            pCVar11 = RefAt<absl::lts_20250127::Cord>
                                ((void *)offset,(ulong)(print_error.entry)->offset);
            pCVar11 = absl::lts_20250127::log_internal::
                      GetReferenceableValue<absl::lts_20250127::Cord>(pCVar11);
            local_1b8 = absl::lts_20250127::log_internal::
                        Check_EQImpl<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
                                  (pCVar10,pCVar11,
                                   "RefAt<absl::Cord>(base, entry.offset) == RefAt<absl::Cord>(default_base, entry.offset)"
                                  );
            if (local_1b8 != (Nullable<const_char_*>)0x0) {
              pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_1b8);
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_1d0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x94,pcVar12);
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d0);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_
                        ((string *)&absl_log_internal_check_op_result_4,&stack0xffffffffffffffa0);
              pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                  (pLVar16,(string *)&absl_log_internal_check_op_result_4);
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b9,pLVar16);
              std::__cxx11::string::~string((string *)&absl_log_internal_check_op_result_4);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_1d0);
            }
            local_1b8 = (Nullable<const_char_*>)0x0;
          }
        }
        else if (uVar2 == 0x100) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xa2);
        }
        break;
      case 6:
        if (((print_error.entry)->type_card & 0x180) != 0) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb3);
        }
        if ((base._7_1_ & 1) != 0) {
          ppMVar15 = RefAt<google::protobuf::MessageLite_const*>
                               (default_base,(ulong)(print_error.entry)->offset);
          local_249 = 0;
          if (*ppMVar15 == (MessageLite *)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0xab,"RefAt<const MessageLite*>(base, entry.offset) != nullptr");
            local_249 = 1;
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_248);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_270,&stack0xffffffffffffffa0);
            pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,&local_270);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_231,pLVar16);
            std::__cxx11::string::~string((string *)&local_270);
          }
          if ((local_249 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_248);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TcParser::VerifyHasBitConsistency(const MessageLite* msg,
                                       const TcParseTableBase* table) {
  namespace fl = internal::field_layout;
  if (table->has_bits_offset == 0) {
    // Nothing to check
    return;
  }

  for (const auto& entry : table->field_entries()) {
    const auto print_error = [&] {
      return absl::StrFormat("Type=%s Field=%d\n", msg->GetTypeName(),
                             FieldNumber(table, &entry));
    };
    if ((entry.type_card & fl::kFcMask) != fl::kFcOptional) return;
    const bool has_bit = ReadHas(entry, msg);
    const void* base = msg;
    const void* default_base = table->default_instance();
    if ((entry.type_card & field_layout::kSplitMask) ==
        field_layout::kSplitTrue) {
      const size_t offset = table->field_aux(kSplitOffsetAuxIdx)->offset;
      base = TcParser::RefAt<const void*>(base, offset);
      default_base = TcParser::RefAt<const void*>(default_base, offset);
    }
    switch (entry.type_card & fl::kFkMask) {
      case fl::kFkVarint:
      case fl::kFkFixed:
        // Numerics can have any value when the has bit is on.
        if (has_bit) return;
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRep8Bits:
            ABSL_CHECK_EQ(RefAt<bool>(base, entry.offset),
                          RefAt<bool>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep32Bits:
            ABSL_CHECK_EQ(RefAt<uint32_t>(base, entry.offset),
                          RefAt<uint32_t>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep64Bits:
            ABSL_CHECK_EQ(RefAt<uint64_t>(base, entry.offset),
                          RefAt<uint64_t>(default_base, entry.offset))
                << print_error();
            break;
        }
        break;

      case fl::kFkString:
        switch (entry.type_card & fl::kRepMask) {
          case field_layout::kRepAString:
            if (has_bit) {
              // Must not point to the default.
              ABSL_CHECK(!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault())
                  << print_error();
            } else {
              // We should technically check that the value matches the default
              // value of the field, but the prototype does not actually contain
              // this value. Non-empty defaults are loaded on access.
            }
            break;
          case field_layout::kRepCord:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(RefAt<absl::Cord>(base, entry.offset),
                            RefAt<absl::Cord>(default_base, entry.offset))
                  << print_error();
            }
            break;
          case field_layout::kRepIString:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(
                  RefAt<InlinedStringField>(base, entry.offset).Get(),
                  RefAt<InlinedStringField>(default_base, entry.offset).Get())
                  << print_error();
            }
            break;
          case field_layout::kRepSString:
            Unreachable();
        }
        break;
      case fl::kFkMessage:
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRepMessage:
          case fl::kRepGroup:
            if (has_bit) {
              ABSL_CHECK(RefAt<const MessageLite*>(base, entry.offset) !=
                         nullptr)
                  << print_error();
            } else {
              // An off has_bit does not imply a null pointer.
              // We might have a previous instance that we cached.
            }
            break;
          default:
            Unreachable();
        }
        break;

      default:
        // All other types are not `optional`.
        Unreachable();
    }
  }
}